

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

float PsiEN(float *ve,float *va)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double __x;
  double dVar5;
  undefined1 auVar6 [16];
  float fVar7;
  
  fVar3 = norm(va,2);
  fVar4 = norm(ve,2);
  if ((double)fVar4 <= 1e-08) {
    fVar7 = 100.0;
  }
  else {
    fVar1 = *ve;
    fVar2 = ve[1];
    auVar6._0_8_ = (double)(fVar3 * fVar3) + 1.0;
    auVar6._8_8_ = (double)(fVar4 * fVar4) + 1.0;
    auVar6 = sqrtpd(auVar6,auVar6);
    __x = (double)(float)((double)((*va * (fVar1 / fVar4) + va[1] * (fVar2 / fVar4)) - fVar4) /
                         (auVar6._8_8_ * auVar6._0_8_));
    dVar5 = asin(__x);
    fVar7 = (float)((dVar5 * 180.0) / 3.141592653589793);
    if (90.0 < ABS(fVar7)) {
      printf("ERROR in PSIEN()  v1: %f ve: %f\n",(double)fVar7,__x);
      printf("nve: %f nva: %f\n",(double)fVar4,(double)fVar3);
      printf("n: %f %f\n",(double)(fVar1 / fVar4),(double)(fVar2 / fVar4));
      printf(" ve: %f %f va: %f %f\n",(double)*ve,(double)ve[1],SUB84((double)*va,0),(double)va[1]);
      fflush(_stdout);
    }
  }
  return ABS(fVar7);
}

Assistant:

float PsiEN(float ve[],float va[])
{
float nva,nve;
float v1,v2;
float n[2];

nva = norm(va,2), nve = norm(ve,2);
if(nve > 0.00000001)
{
n[0] = ve[0]/nve;
n[1] = ve[1]/nve;
v1 = (va[0]*n[0] + va[1]*n[1]-nve) ;
v2 = (float) (v1/(sqrt((1.0+nva*nva))*sqrt((1.0+nve*nve))));
v1 =  (float) (asin(v2)*180.0/HALF_C);

if(!(v1>=-90.0 && v1<=90.0))
	{
       	printf("ERROR in PSIEN()  v1: %f ve: %f\n",v1,v2);
	printf("nve: %f nva: %f\n",nve,nva);
	printf("n: %f %f\n",n[0],n[1]);
	printf(" ve: %f %f va: %f %f\n",ve[0],ve[1],va[0],va[1]);
	fflush(stdout);
	}
}
else v1 = NO_VALUE;

return (float) fabs(v1);
}